

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_interface.cpp
# Opt level: O1

void UI::execute_rotate(int *argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  _Alloc_hider _Var4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  int *piVar9;
  undefined8 uVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  double dVar12;
  double theta_z;
  double theta_y;
  double theta_x;
  double ori_z;
  double ori_y;
  double ori_x;
  string outfile_path;
  string input_path;
  geofile primary_geofile;
  string local_488;
  allocator<char> local_466;
  allocator<char> local_465;
  allocator<char> local_464;
  allocator<char> local_463;
  allocator<char> local_462;
  allocator<char> local_461;
  char *local_460;
  double local_458;
  double local_450;
  double local_448;
  double local_440;
  double local_438;
  double local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  string local_408;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_388;
  long local_380;
  size_type local_378 [2];
  string local_368;
  string local_348;
  string local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  string local_248;
  geofile local_228;
  
  if (*argc != 0xb) {
    local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_288,"Error: incorrect argument count.","");
    print_ln(&local_288);
    local_388 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_288._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p == &local_288.field_2) {
      return;
    }
    goto LAB_0010f056;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_388,argv[3],(allocator<char> *)&local_228);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_428,argv[4],(allocator<char> *)&local_228);
  GEO::geofile::geofile(&local_228);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_488,argv[5],(allocator<char> *)&local_460);
  bVar5 = GEO::is_e_notation(&local_488);
  if (bVar5) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,argv[6],&local_461);
    bVar6 = GEO::is_e_notation(&local_2a8);
    if (!bVar6) goto LAB_0010e95d;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c8,argv[7],&local_462);
    bVar6 = GEO::is_e_notation(&local_2c8);
    if (!bVar6) {
      bVar6 = true;
      goto LAB_0010e960;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,argv[8],&local_463);
    bVar6 = GEO::is_e_notation(&local_2e8);
    if (!bVar6) {
      bVar6 = true;
      bVar3 = true;
      goto LAB_0010e966;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_308,argv[9],&local_464);
    bVar6 = GEO::is_e_notation(&local_308);
    if (!bVar6) {
      bVar6 = true;
      bVar3 = true;
      bVar2 = true;
      goto LAB_0010e968;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,argv[10],&local_465);
    bVar7 = GEO::is_e_notation(&local_248);
    bVar6 = true;
    bVar3 = true;
    bVar2 = true;
    bVar1 = true;
  }
  else {
LAB_0010e95d:
    bVar6 = false;
LAB_0010e960:
    bVar3 = false;
LAB_0010e966:
    bVar2 = false;
LAB_0010e968:
    bVar1 = false;
    bVar7 = false;
  }
  if ((bVar1) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2)) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  if ((bVar2) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2)) {
    operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
  }
  if ((bVar3) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2)) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  if ((bVar6) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2)) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
  }
  if ((bVar5) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2)) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  paVar11 = &local_488.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488._M_dataplus._M_p != paVar11) {
    operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
  }
  if (bVar7 == false) {
LAB_0010eaa3:
    local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_408,"Error: Shifting parameters unrecognized. Terminating.","");
    print_ln(&local_408);
    local_268._M_dataplus._M_p = local_408._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408._M_dataplus._M_p != &local_408.field_2) {
LAB_0010f007:
      operator_delete(local_268._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
    }
LAB_0010f00f:
    GEO::geofile::~geofile(&local_228);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_428._M_dataplus._M_p != &local_428.field_2) {
      operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
    }
    local_288.field_2._M_allocated_capacity = local_378[0];
    if (local_388 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378) {
      return;
    }
LAB_0010f056:
    operator_delete(local_388,local_288.field_2._M_allocated_capacity + 1);
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_488,argv[5],(allocator<char> *)&local_438);
  _Var4._M_p = local_488._M_dataplus._M_p;
  piVar9 = __errno_location();
  iVar8 = *piVar9;
  *piVar9 = 0;
  dVar12 = strtod(_Var4._M_p,&local_460);
  if (local_460 == _Var4._M_p) {
    std::__throw_invalid_argument("stod");
LAB_0010f07c:
    std::__throw_invalid_argument("stod");
LAB_0010f088:
    std::__throw_invalid_argument("stod");
LAB_0010f094:
    std::__throw_invalid_argument("stod");
  }
  else {
    if (*piVar9 == 0) {
      *piVar9 = iVar8;
    }
    else if (*piVar9 == 0x22) {
      std::__throw_out_of_range("stod");
      goto LAB_0010eaa3;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_488._M_dataplus._M_p != paVar11) {
      operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
    }
    local_430 = dVar12;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_488,argv[6],(allocator<char> *)&local_440);
    _Var4._M_p = local_488._M_dataplus._M_p;
    iVar8 = *piVar9;
    *piVar9 = 0;
    dVar12 = strtod(local_488._M_dataplus._M_p,&local_460);
    if (local_460 == _Var4._M_p) goto LAB_0010f07c;
    if (*piVar9 == 0) {
LAB_0010eb75:
      *piVar9 = iVar8;
    }
    else if (*piVar9 == 0x22) {
      dVar12 = (double)std::__throw_out_of_range("stod");
      goto LAB_0010eb75;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_488._M_dataplus._M_p != paVar11) {
      operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
    }
    local_438 = dVar12;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_488,argv[7],(allocator<char> *)&local_448);
    _Var4._M_p = local_488._M_dataplus._M_p;
    iVar8 = *piVar9;
    *piVar9 = 0;
    dVar12 = strtod(local_488._M_dataplus._M_p,&local_460);
    if (local_460 == _Var4._M_p) goto LAB_0010f088;
    if (*piVar9 == 0) {
LAB_0010ebf5:
      *piVar9 = iVar8;
    }
    else if (*piVar9 == 0x22) {
      dVar12 = (double)std::__throw_out_of_range("stod");
      goto LAB_0010ebf5;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_488._M_dataplus._M_p != paVar11) {
      operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
    }
    local_440 = dVar12;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_488,argv[8],(allocator<char> *)&local_450);
    _Var4._M_p = local_488._M_dataplus._M_p;
    iVar8 = *piVar9;
    *piVar9 = 0;
    dVar12 = strtod(local_488._M_dataplus._M_p,&local_460);
    if (local_460 == _Var4._M_p) goto LAB_0010f094;
    if (*piVar9 == 0) {
LAB_0010ec75:
      *piVar9 = iVar8;
    }
    else if (*piVar9 == 0x22) {
      dVar12 = (double)std::__throw_out_of_range("stod");
      goto LAB_0010ec75;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_488._M_dataplus._M_p != paVar11) {
      operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
    }
    local_448 = dVar12;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_488,argv[9],(allocator<char> *)&local_458);
    _Var4._M_p = local_488._M_dataplus._M_p;
    iVar8 = *piVar9;
    *piVar9 = 0;
    dVar12 = strtod(local_488._M_dataplus._M_p,&local_460);
    if (local_460 != _Var4._M_p) {
      if (*piVar9 == 0) {
LAB_0010ecf5:
        *piVar9 = iVar8;
      }
      else if (*piVar9 == 0x22) {
        dVar12 = (double)std::__throw_out_of_range("stod");
        goto LAB_0010ecf5;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_488._M_dataplus._M_p != paVar11) {
        operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
      }
      local_450 = dVar12;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_488,argv[10],&local_466);
      _Var4._M_p = local_488._M_dataplus._M_p;
      iVar8 = *piVar9;
      *piVar9 = 0;
      dVar12 = strtod(local_488._M_dataplus._M_p,&local_460);
      if (local_460 == _Var4._M_p) goto LAB_0010f0ac;
      if (*piVar9 == 0) {
LAB_0010ed75:
        *piVar9 = iVar8;
      }
      else if (*piVar9 == 0x22) {
        dVar12 = (double)std::__throw_out_of_range("stod");
        goto LAB_0010ed75;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_488._M_dataplus._M_p != paVar11) {
        operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
      }
      local_458 = dVar12;
      local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_3a8,local_388,local_388->_M_local_buf + local_380);
      iVar8 = GEO::geofile::import_geofile(&local_228,&local_3a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
        operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
      }
      if (iVar8 == 0) {
        iVar8 = GEO::geofile::rotate_data
                          (&local_228,&local_430,&local_438,&local_440,&local_448,&local_450,
                           &local_458);
        if (iVar8 == 0) {
          local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_3c8,"Rotation completed.","");
          print_ln(&local_3c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
            operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
          }
          local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_3e8,local_428._M_dataplus._M_p,
                     local_428._M_dataplus._M_p + local_428._M_string_length);
          iVar8 = GEO::geofile::export_geofile(&local_228,&local_3e8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
            operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
          }
          if (iVar8 == 0) {
            std::operator+(&local_268,"File exported as ",&local_428);
            print_ln(&local_268);
            paVar11 = &local_268.field_2;
          }
          else {
            paVar11 = &local_328.field_2;
            local_328._M_dataplus._M_p = (pointer)paVar11;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_328,"Error: Export failed.","");
            print_ln(&local_328);
            local_268._M_dataplus._M_p = local_328._M_dataplus._M_p;
          }
        }
        else {
          paVar11 = &local_348.field_2;
          local_348._M_dataplus._M_p = (pointer)paVar11;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_348,"Error: Translation failed.","");
          print_ln(&local_348);
          local_268._M_dataplus._M_p = local_348._M_dataplus._M_p;
        }
      }
      else {
        paVar11 = &local_368.field_2;
        local_368._M_dataplus._M_p = (pointer)paVar11;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_368,"Import of geofile failed.","");
        print_ln(&local_368);
        local_268._M_dataplus._M_p = local_368._M_dataplus._M_p;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != paVar11) {
        local_408.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        goto LAB_0010f007;
      }
      goto LAB_0010f00f;
    }
  }
  std::__throw_invalid_argument("stod");
LAB_0010f0ac:
  uVar10 = std::__throw_invalid_argument("stod");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  GEO::geofile::~geofile(&local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428._M_dataplus._M_p != &local_428.field_2) {
    operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
  }
  if (local_388 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378) {
    operator_delete(local_388,local_378[0] + 1);
  }
  _Unwind_Resume(uVar10);
}

Assistant:

void UI::execute_rotate(int &argc, char *argv[])
{
    if (argc!=11)
    {
        print_ln("Error: incorrect argument count.");
    }
    else
    {
        std::string input_path   = argv[3];
        std::string outfile_path = argv[4];
        GEO::geofile primary_geofile;
        if ((GEO::is_e_notation(argv[5]))&&
            (GEO::is_e_notation(argv[6]))&&
            (GEO::is_e_notation(argv[7]))&&
            (GEO::is_e_notation(argv[8]))&&
            (GEO::is_e_notation(argv[9]))&&
            (GEO::is_e_notation(argv[10])))
        {
            double ori_x = std::stod(argv[5]);
            double ori_y = std::stod(argv[6]);
            double ori_z = std::stod(argv[7]);
            double theta_x = std::stod(argv[8]);
            double theta_y = std::stod(argv[9]);
            double theta_z = std::stod(argv[10]);
            if(primary_geofile.import_geofile(input_path)==EXIT_SUCCESS)
            {
                if(primary_geofile.rotate_data( ori_x,   ori_y,   ori_z,
                                                theta_x, theta_y, theta_z)==EXIT_SUCCESS)
                {
                    print_ln("Rotation completed.");
                    if(primary_geofile.export_geofile(outfile_path)==EXIT_SUCCESS)
                        print_ln(("File exported as "+outfile_path));
                    else
                        print_ln("Error: Export failed.");
                }
                else
                    print_ln("Error: Translation failed.");
            }
            else
                print_ln("Import of geofile failed.");
        }
        else
            print_ln("Error: Shifting parameters unrecognized. Terminating.");
    }
}